

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O3

bool __thiscall libwebm::BCMVHeader::Write(BCMVHeader *this,PacketDataBuffer *buffer)

{
  pointer *ppuVar1;
  iterator __position;
  bool bVar2;
  int iVar3;
  int i;
  long lVar4;
  uint8_t bcmv_buffer [6];
  uint8_t local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined2 local_1a;
  
  if (buffer == (PacketDataBuffer *)0x0) {
    Write();
    bVar2 = false;
  }
  else {
    lVar4 = 0;
    do {
      __position._M_current =
           (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)buffer,__position,
                   this->bcmv + lVar4);
      }
      else {
        *__position._M_current = this->bcmv[lVar4];
        ppuVar1 = &(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    iVar3 = this->length + 10;
    local_1e = (uint8_t)((uint)iVar3 >> 0x18);
    local_1d = (undefined1)((uint)iVar3 >> 0x10);
    local_1c = (undefined1)((uint)iVar3 >> 8);
    local_1b = (undefined1)iVar3;
    local_1a = 0;
    bVar2 = CopyAndEscapeStartCodes(&local_1e,6,buffer);
  }
  return bVar2;
}

Assistant:

bool BCMVHeader::Write(PacketDataBuffer* buffer) const {
  if (buffer == nullptr) {
    std::fprintf(stderr, "Webm2Pes: nullptr for buffer in BCMV Write.\n");
    return false;
  }
  const int kBcmvSize = 4;
  for (int i = 0; i < kBcmvSize; ++i)
    buffer->push_back(bcmv[i]);

  // Note: The 4 byte length field must include the size of the BCMV header.
  const int kRemainingBytes = 6;
  const uint32_t bcmv_total_length = length + static_cast<uint32_t>(size());
  const uint8_t bcmv_buffer[kRemainingBytes] = {
      static_cast<std::uint8_t>((bcmv_total_length >> 24) & 0xff),
      static_cast<std::uint8_t>((bcmv_total_length >> 16) & 0xff),
      static_cast<std::uint8_t>((bcmv_total_length >> 8) & 0xff),
      static_cast<std::uint8_t>(bcmv_total_length & 0xff),
      0,
      0 /* 2 bytes 0 padding */};

  return CopyAndEscapeStartCodes(bcmv_buffer, kRemainingBytes, buffer);
}